

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::_::HeapDisposer<capnp::SchemaParser::ModuleImpl>::disposeImpl
          (HeapDisposer<capnp::SchemaParser::ModuleImpl> *this,void *pointer)

{
  void *pointer_local;
  HeapDisposer<capnp::SchemaParser::ModuleImpl> *this_local;
  
  if (pointer != (void *)0x0) {
    ::capnp::SchemaParser::ModuleImpl::~ModuleImpl((ModuleImpl *)pointer);
    operator_delete(pointer,0x58);
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }